

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_DeletePropertyInt64(JSContext *ctx,JSValue obj,int64_t idx,int flags)

{
  int iVar1;
  JSAtom prop;
  
  if ((ulong)idx < 0x80000000) {
    iVar1 = JS_DeleteProperty(ctx,obj,(uint)idx | 0x80000000,flags);
    return iVar1;
  }
  prop = JS_NewAtomInt64(ctx,idx);
  if (prop == 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = JS_DeleteProperty(ctx,obj,prop,flags);
    JS_FreeAtom(ctx,prop);
  }
  return iVar1;
}

Assistant:

int JS_DeletePropertyInt64(JSContext *ctx, JSValueConst obj, int64_t idx, int flags)
{
    JSAtom prop;
    int res;

    if ((uint64_t)idx <= JS_ATOM_MAX_INT) {
        /* fast path for fast arrays */
        return JS_DeleteProperty(ctx, obj, __JS_AtomFromUInt32(idx), flags);
    }
    prop = JS_NewAtomInt64(ctx, idx);
    if (prop == JS_ATOM_NULL)
        return -1;
    res = JS_DeleteProperty(ctx, obj, prop, flags);
    JS_FreeAtom(ctx, prop);
    return res;
}